

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xoshiro256plus.hpp
# Opt level: O0

void __thiscall trng::xoshiro256plus::jump(xoshiro256plus *this,unsigned_long_long s)

{
  const_reference pvVar1;
  reference pvVar2;
  ulong in_RSI;
  xoshiro256plus *in_RDI;
  int i_2;
  result_type r_j;
  int j_1;
  vector<trng::GF2,_256UL> v1;
  vector<trng::GF2,_256UL> v0;
  int j;
  vector<trng::GF2,_256UL> v;
  xoshiro256plus R;
  int i_1;
  matrix<trng::GF2,_256UL> M;
  uint i;
  undefined7 in_stack_fffffffffffffec8;
  undefined1 in_stack_fffffffffffffecf;
  vector<trng::GF2,_256UL> *in_stack_fffffffffffffed0;
  undefined4 in_stack_fffffffffffffef0;
  undefined4 in_stack_fffffffffffffef4;
  int iVar3;
  matrix<trng::GF2,_256UL> *in_stack_fffffffffffffef8;
  ulong uVar4;
  int local_fc;
  unsigned_long_long in_stack_ffffffffffffff30;
  status_type *in_stack_ffffffffffffff38;
  int local_ac;
  status_type local_88;
  xoshiro256plus local_58;
  int local_34;
  uint local_14;
  ulong local_10;
  
  if (in_RSI < 0x10) {
    local_10 = in_RSI;
    for (local_14 = 0; local_14 < local_10; local_14 = local_14 + 1) {
      step(in_RDI);
    }
  }
  else {
    matrix<trng::GF2,_256UL>::matrix
              ((matrix<trng::GF2,_256UL> *)
               CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0));
    for (local_34 = 0; local_34 < 0x100; local_34 = local_34 + 1) {
      xoshiro256plus((xoshiro256plus *)0x2ed3b3);
      status_type::status_type(&local_88,local_34);
      local_58.S.r[2] = local_88.r[2];
      local_58.S.r[3] = local_88.r[3];
      local_58.S.r[0] = local_88.r[0];
      local_58.S.r[1] = local_88.r[1];
      step(&local_58);
      status_type::to_vector(in_stack_ffffffffffffff38);
      for (local_ac = 0; local_ac < 0x100; local_ac = local_ac + 1) {
        pvVar1 = vector<trng::GF2,_256UL>::operator()
                           (in_stack_fffffffffffffed0,
                            CONCAT17(in_stack_fffffffffffffecf,in_stack_fffffffffffffec8));
        pvVar2 = matrix<trng::GF2,_256UL>::operator()
                           ((matrix<trng::GF2,_256UL> *)in_stack_fffffffffffffed0,
                            CONCAT17(in_stack_fffffffffffffecf,in_stack_fffffffffffffec8),0x2ed466);
        pvVar2->value = pvVar1->value;
      }
      vector<trng::GF2,_256UL>::~vector((vector<trng::GF2,_256UL> *)0x2ed4da);
    }
    status_type::to_vector(in_stack_ffffffffffffff38);
    power<trng::GF2,256ul>
              ((matrix<trng::GF2,_256UL> *)in_stack_ffffffffffffff38,in_stack_ffffffffffffff30);
    trng::operator*(in_stack_fffffffffffffef8,
                    (vector<trng::GF2,_256UL> *)
                    CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0));
    matrix<trng::GF2,_256UL>::~matrix((matrix<trng::GF2,_256UL> *)0x2ed53d);
    for (local_fc = 0; local_fc < 4; local_fc = local_fc + 1) {
      uVar4 = 0;
      for (iVar3 = 0; iVar3 < 0x40; iVar3 = iVar3 + 1) {
        uVar4 = uVar4 * 2;
        in_stack_fffffffffffffed0 =
             (vector<trng::GF2,_256UL> *)
             vector<trng::GF2,_256UL>::operator()
                       (in_stack_fffffffffffffed0,
                        CONCAT17(in_stack_fffffffffffffecf,in_stack_fffffffffffffec8));
        in_stack_fffffffffffffecf = GF2::operator_cast_to_bool((GF2 *)in_stack_fffffffffffffed0);
        if ((bool)in_stack_fffffffffffffecf) {
          uVar4 = uVar4 | 1;
        }
      }
      (in_RDI->S).r[local_fc] = uVar4;
    }
    vector<trng::GF2,_256UL>::~vector((vector<trng::GF2,_256UL> *)0x2ed65c);
    vector<trng::GF2,_256UL>::~vector((vector<trng::GF2,_256UL> *)0x2ed666);
    matrix<trng::GF2,_256UL>::~matrix((matrix<trng::GF2,_256UL> *)0x2ed673);
  }
  return;
}

Assistant:

TRNG_CUDA_ENABLE
  inline void xoshiro256plus::jump(unsigned long long s) {
    if (s < 16) {
      for (unsigned int i{0}; i < s; ++i)
        step();
    } else {
      matrix<GF2, 256> M;
      for (int i{0}; i < 256; ++i) {
        xoshiro256plus R;
        R.S = status_type(i, status_type::eye{});
        R.step();
        const vector<GF2, 256> v{R.S.to_vector()};
        for (int j{0}; j < 256; ++j)
          M(j, i) = v(j);
      }

      const vector<GF2, 256> v0{S.to_vector()};
      const vector<GF2, 256> v1{power(M, s) * v0};

      for (int j{0}; j < 4; ++j) {
        result_type r_j{0};
        for (int i{0}; i < 64; ++i) {
          r_j <<= 1;
          if (static_cast<bool>(v1(i + 64 * j)))
            r_j |= 1;
        }
        S.r[j] = r_j;
      }
    }
  }